

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode DataValue_decodeBinary(UA_DataValue *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  
  pUVar1 = pos + 1;
  uVar3 = 0x80070000;
  if (pUVar1 <= end) {
    bVar2 = *pos;
    uVar3 = 0;
    pos = pUVar1;
    if ((bVar2 & 1) != 0) {
      *(byte *)dst = *(byte *)dst | 1;
      uVar3 = Variant_decodeBinary(&dst->value,_);
    }
    if ((bVar2 & 2) != 0) {
      *(byte *)dst = *(byte *)dst | 2;
      uVar4 = 0x80070000;
      if (pos + 4 <= end) {
        dst->status = *(UA_StatusCode *)pos;
        uVar4 = 0;
        pos = pos + 4;
      }
      uVar3 = uVar3 | uVar4;
    }
    if ((bVar2 & 4) != 0) {
      *(byte *)dst = *(byte *)dst | 4;
      uVar4 = 0x80070000;
      if (pos + 8 <= end) {
        dst->sourceTimestamp = *(UA_DateTime *)pos;
        uVar4 = 0;
        pos = pos + 8;
      }
      uVar3 = uVar3 | uVar4;
    }
    if ((bVar2 & 0x10) != 0) {
      *(byte *)dst = *(byte *)dst | 0x10;
      if (end < pos + 2) {
        uVar5 = dst->sourcePicoseconds;
        uVar4 = 0x80070000;
      }
      else {
        uVar5 = *(ushort *)pos;
        dst->sourcePicoseconds = uVar5;
        uVar4 = 0;
        pos = pos + 2;
      }
      uVar3 = uVar4 | uVar3;
      if (9999 < uVar5) {
        dst->sourcePicoseconds = 9999;
      }
    }
    if ((bVar2 & 8) != 0) {
      *(byte *)dst = *(byte *)dst | 8;
      uVar4 = 0x80070000;
      if (pos + 8 <= end) {
        dst->serverTimestamp = *(UA_DateTime *)pos;
        uVar4 = 0;
        pos = pos + 8;
      }
      uVar3 = uVar3 | uVar4;
    }
    if ((bVar2 & 0x20) != 0) {
      *(byte *)dst = *(byte *)dst | 0x20;
      if (end < pos + 2) {
        uVar5 = dst->serverPicoseconds;
        uVar4 = 0x80070000;
      }
      else {
        uVar5 = *(ushort *)pos;
        dst->serverPicoseconds = uVar5;
        uVar4 = 0;
        pos = pos + 2;
      }
      uVar3 = uVar4 | uVar3;
      if (9999 < uVar5) {
        dst->serverPicoseconds = 9999;
      }
    }
  }
  return uVar3;
}

Assistant:

static UA_StatusCode
DataValue_decodeBinary(UA_DataValue *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasValue = true;
        retval |= Variant_decodeBinary(&dst->value, NULL);
    }
    if(encodingMask & 0x02) {
        dst->hasStatus = true;
        retval |= StatusCode_decodeBinary(&dst->status);
    }
    if(encodingMask & 0x04) {
        dst->hasSourceTimestamp = true;
        retval |= DateTime_decodeBinary(&dst->sourceTimestamp);
    }
    if(encodingMask & 0x10) {
        dst->hasSourcePicoseconds = true;
        retval |= UInt16_decodeBinary(&dst->sourcePicoseconds, NULL);
        if(dst->sourcePicoseconds > MAX_PICO_SECONDS)
            dst->sourcePicoseconds = MAX_PICO_SECONDS;
    }
    if(encodingMask & 0x08) {
        dst->hasServerTimestamp = true;
        retval |= DateTime_decodeBinary(&dst->serverTimestamp);
    }
    if(encodingMask & 0x20) {
        dst->hasServerPicoseconds = true;
        retval |= UInt16_decodeBinary(&dst->serverPicoseconds, NULL);
        if(dst->serverPicoseconds > MAX_PICO_SECONDS)
            dst->serverPicoseconds = MAX_PICO_SECONDS;
    }
    return retval;
}